

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nsh_cmd.c
# Opt level: O1

void nsh_cmd_swap(nsh_cmd_t *cmd1,nsh_cmd_t *cmd2)

{
  nsh_cmd_handler_t *pnVar1;
  nsh_cmd_t temp;
  char local_38 [16];
  
  pnVar1 = cmd1->handler;
  strncpy(local_38,cmd1->name,0x10);
  cmd1->handler = cmd2->handler;
  strncpy(cmd1->name,cmd2->name,0x10);
  cmd2->handler = pnVar1;
  strncpy(cmd2->name,local_38,0x10);
  return;
}

Assistant:

void nsh_cmd_swap(nsh_cmd_t* cmd1, nsh_cmd_t* cmd2)
{
    nsh_cmd_t temp;
    nsh_cmd_copy(&temp, cmd1);
    nsh_cmd_copy(cmd1, cmd2);
    nsh_cmd_copy(cmd2, &temp);
}